

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Name __thiscall wasm::makeHighName(wasm *this,Name n)

{
  char **__return_storage_ptr__;
  undefined1 local_70 [8];
  Name n_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string_view local_20;
  
  n_local.super_IString.str._M_len = n.super_IString.str._M_len;
  __return_storage_ptr__ = &n_local.super_IString.str._M_str;
  local_70 = (undefined1  [8])this;
  IString::toString_abi_cxx11_((string *)__return_storage_ptr__,(IString *)local_70);
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"$hi");
  IString::IString((IString *)&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&n_local.super_IString.str._M_str);
  return (IString)(IString)local_20;
}

Assistant:

static Name makeHighName(Name n) { return n.toString() + "$hi"; }